

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::InterpolationExpr::InterpolationExpr
          (InterpolationExpr *this,
          unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *start,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *interpolated,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *end,Token *token)

{
  Token *token_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *end_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *interpolated_local;
  unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *start_local;
  InterpolationExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__InterpolationExpr_0016a888;
  std::unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_>::unique_ptr
            (&this->start,start);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr
            (&this->interpolated,interpolated);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->end,end);
  Token::Token(&this->token,token);
  return;
}

Assistant:

InterpolationExpr(
                std::unique_ptr<StringExpr> start,
                std::unique_ptr<Expr> interpolated,
                std::unique_ptr<Expr> end,
                Token token) :
                start{std::move(start)},
                interpolated{std::move(interpolated)},
                end{std::move(end)},
                token{std::move(token)} {}